

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

cio_error write_ping_or_pong_message
                    (cio_websocket *websocket,cio_websocket_frame_type frame_type,
                    cio_websocket_write_job *job,cio_write_buffer *payload,
                    cio_websocket_write_handler_t handler,void *handler_context)

{
  cio_write_buffer *pcVar1;
  ulong uVar2;
  cio_error cStack_10;
  
  cStack_10 = CIO_INVALID_ARGUMENT;
  if (handler != (cio_websocket_write_handler_t)0x0) {
    if ((payload != (cio_write_buffer *)0x0) && (pcVar1 = payload->next, pcVar1 != payload)) {
      uVar2 = 0;
      do {
        uVar2 = uVar2 + (pcVar1->data).element.length;
        pcVar1 = pcVar1->next;
      } while (pcVar1 != payload);
      if (0x7d < uVar2) {
        return CIO_INVALID_ARGUMENT;
      }
    }
    if (job->wbh == (cio_write_buffer *)0x0) {
      job->wbh = payload;
      job->handler = handler;
      job->handler_context = handler_context;
      job->frame_type = frame_type;
      job->last_frame = true;
      job->stream_handler = message_written;
      enqueue_job(websocket,job,(payload->data).element.length);
      cStack_10 = CIO_SUCCESS;
    }
    else {
      cStack_10 = CIO_OPERATION_NOT_PERMITTED;
    }
  }
  return cStack_10;
}

Assistant:

static enum cio_error write_ping_or_pong_message(struct cio_websocket *websocket, enum cio_websocket_frame_type frame_type, struct cio_websocket_write_job *job, struct cio_write_buffer *payload, cio_websocket_write_handler_t handler, void *handler_context)
{
	if (cio_unlikely(handler == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	if (cio_unlikely(payload_size_in_limit(payload, CIO_WEBSOCKET_SMALL_FRAME_SIZE) == 0)) {
		return CIO_INVALID_ARGUMENT;
	}

	if (cio_unlikely(job->wbh != NULL)) {
		return CIO_OPERATION_NOT_PERMITTED;
	}

	job->wbh = payload;
	job->handler = handler;
	job->handler_context = handler_context;
	job->frame_type = frame_type;
	job->last_frame = true;
	job->stream_handler = message_written;

	size_t length = cio_write_buffer_get_total_size(payload);
	enqueue_job(websocket, job, length);
	return CIO_SUCCESS;
}